

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O1

char * __thiscall
ctemplate_htmlparser::HtmlparserCppTest::IdToName
          (HtmlparserCppTest *this,IdNameMap *list,int enum_id)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  size_t sVar2;
  IdNameMap *pIVar3;
  bool bVar4;
  int iVar5;
  HtmlparserCppTest *pHVar6;
  HtmlparserCppTest *extraout_RAX;
  long lVar7;
  HtmlparserCppTest *pHVar8;
  char *pcVar9;
  HtmlparserCppTest *pHVar10;
  HtmlparserCppTest *pHVar11;
  HtmlparserCppTest *extraout_RAX_00;
  HtmlparserCppTest *pHVar12;
  HtmlparserCppTest *extraout_RAX_01;
  undefined7 extraout_var;
  undefined8 uVar13;
  undefined7 extraout_var_00;
  HtmlparserCppTest *extraout_RAX_02;
  char *extraout_RAX_03;
  HtmlparserCppTest *this_00;
  char *extraout_RAX_04;
  char *extraout_RAX_05;
  int *piVar14;
  HtmlParser *this_01;
  const_iterator cVar15;
  mapped_type *ppHVar16;
  char *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  char *extraout_RDX;
  undefined7 uVar17;
  ulong uVar18;
  htmlparser_ctx *phVar19;
  undefined1 *puVar20;
  undefined1 *puVar21;
  htmlparser_ctx_s *phVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  pointer this_02;
  _Base_ptr unaff_R12;
  string *unaff_R14;
  pointer str_00;
  _Base_ptr unaff_R15;
  bool bVar25;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_268;
  _Base_ptr p_Stack_250;
  _Base_ptr p_Stack_248;
  undefined1 auStack_208 [16];
  _Base_ptr p_Stack_1f8;
  HtmlparserCppTest *pHStack_1f0;
  _Base_ptr p_Stack_1e8;
  undefined1 auStack_1e0 [16];
  _Base_ptr p_Stack_1d0;
  HtmlparserCppTest *pHStack_1c8;
  _Base_ptr p_Stack_1c0;
  char *pcStack_1b8;
  HtmlParser HStack_1b0;
  allocator aStack_171;
  HtmlparserCppTest *pHStack_170;
  size_t sStack_168;
  HtmlparserCppTest HStack_160;
  HtmlparserCppTest *pHStack_120;
  ulong uStack_118;
  HtmlparserCppTest *pHStack_108;
  allocator aStack_f1;
  HtmlparserCppTest *pHStack_f0;
  size_t sStack_e8;
  undefined1 auStack_e0 [40];
  HtmlparserCppTest *pHStack_b8;
  HtmlParser HStack_b0;
  HtmlparserCppTest HStack_a8;
  IdNameMap *pIStack_68;
  string *psStack_60;
  allocator aStack_51;
  HtmlparserCppTest *pHStack_50;
  char *pcStack_48;
  
  if (list != (IdNameMap *)0x0) {
    pcVar9 = list->name;
    if (pcVar9 != (char *)0x0) {
      if (list->id != enum_id) {
        list = (IdNameMap *)&list[1].name;
        do {
          pcVar9 = *(char **)list;
          if (pcVar9 == (char *)0x0) goto LAB_00106edb;
          pIVar3 = list + -1;
          list = list + 1;
        } while (*(int *)&pIVar3->name != enum_id);
      }
      return pcVar9;
    }
LAB_00106edb:
    IdToName();
  }
  IdToName();
  if (list != (IdNameMap *)0x0) {
    pcVar9 = list->name;
    while (pcVar9 != (char *)0x0) {
      iVar5 = std::__cxx11::string::compare(extraout_RDX);
      if (iVar5 == 0) goto LAB_00106f1c;
      pIVar3 = list + 1;
      list = list + 1;
      pcVar9 = pIVar3->name;
    }
    NameToId();
LAB_00106f1c:
    return (char *)(ulong)(uint)list->id;
  }
  NameToId();
  pHVar12 = (HtmlparserCppTest *)(this->parser_).parser_;
  psStack_60 = (string *)0x106f3f;
  iVar5 = ctemplate_htmlparser::htmlparser_state((htmlparser_ctx_s *)pHVar12);
  puVar20 = kStateMap;
  psStack_60 = (string *)0x106f4d;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kStateMap,iVar5);
  if (list->name == (char *)0x0) {
    psStack_60 = (string *)0x106fb6;
    ValidateState();
  }
  else {
    unaff_R14 = (string *)&pHStack_50;
    psStack_60 = (string *)0x106f69;
    std::__cxx11::string::string(unaff_R14,(char *)pHVar6,&aStack_51);
    pcVar9 = list->name;
    puVar20 = (undefined1 *)pHVar6;
    if (pcVar9 == pcStack_48) {
      uVar17 = (undefined7)((ulong)list >> 8);
      if (pcVar9 == (char *)0x0) {
        list = (IdNameMap *)CONCAT71(uVar17,1);
      }
      else {
        psStack_60 = (string *)0x106f85;
        puVar20 = (undefined1 *)pHStack_50;
        iVar5 = bcmp(*(void **)list,pHStack_50,(size_t)pcVar9);
        list = (IdNameMap *)CONCAT71(uVar17,iVar5 == 0);
      }
    }
    else {
      list = (IdNameMap *)0x0;
    }
    pHVar6 = (HtmlparserCppTest *)&stack0xffffffffffffffc0;
    if (pHStack_50 != pHVar6) {
      psStack_60 = (string *)0x106fa5;
      operator_delete(pHStack_50);
      pHVar6 = extraout_RAX;
    }
    pHVar12 = pHStack_50;
    if ((char)list != '\0') {
      return (char *)pHVar6;
    }
  }
  psStack_60 = (string *)0x106fbb;
  ValidateState();
  pHVar6 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106fcf;
  pHVar8 = (HtmlparserCppTest *)puVar20;
  pIStack_68 = list;
  psStack_60 = unaff_R14;
  lVar7 = ctemplate_htmlparser::htmlparser_tag((htmlparser_ctx_s *)pHVar6);
  if (lVar7 == 0) {
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106ff9;
    ValidateTag();
  }
  else {
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106fdd;
    pHVar8 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_tag((pHVar12->parser_).parser_);
    HStack_a8.parser_.parser_ = (htmlparser_ctx *)0x106fe8;
    pHVar6 = (HtmlparserCppTest *)puVar20;
    pcVar9 = (char *)std::__cxx11::string::compare(puVar20);
    if ((int)pcVar9 == 0) {
      return pcVar9;
    }
  }
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)ValidateAttribute;
  ValidateTag();
  this_00 = (HtmlparserCppTest *)(pHVar6->parser_).parser_;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x107011;
  pHVar10 = pHVar8;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)puVar20;
  HStack_a8.parser_.parser_ = (htmlparser_ctx *)pHVar12;
  lVar7 = ctemplate_htmlparser::htmlparser_attr((htmlparser_ctx_s *)this_00);
  if (lVar7 == 0) {
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10703b;
    ValidateAttribute();
  }
  else {
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10701f;
    pHVar10 = (HtmlparserCppTest *)ctemplate_htmlparser::htmlparser_attr((pHVar6->parser_).parser_);
    HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10702a;
    this_00 = pHVar8;
    pcVar9 = (char *)std::__cxx11::string::compare((char *)pHVar8);
    if ((int)pcVar9 == 0) {
      return pcVar9;
    }
  }
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)ValidateValue;
  ValidateAttribute();
  pHVar12 = (HtmlparserCppTest *)(this_00->parser_).parser_;
  auStack_e0._24_8_ = (_Base_ptr)0x107056;
  pHVar11 = pHVar10;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pHVar8;
  HStack_a8.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pHVar6;
  lVar7 = ctemplate_htmlparser::htmlparser_value((htmlparser_ctx_s *)pHVar12);
  if (lVar7 != 0) {
    auStack_e0._24_8_ = (_Base_ptr)0x107064;
    pHVar11 = (HtmlparserCppTest *)
              ctemplate_htmlparser::htmlparser_value((this_00->parser_).parser_);
    this_00 = (HtmlparserCppTest *)&pHStack_b8;
    auStack_e0._24_8_ = (_Base_ptr)0x107079;
    pHVar12 = this_00;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar11,(allocator *)(auStack_e0 + 0x27))
    ;
    phVar19 = *(htmlparser_ctx **)
               &(pHVar10->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (phVar19 == HStack_b0.parser_) {
      if (phVar19 == (htmlparser_ctx *)0x0) {
LAB_00107099:
        pHVar12 = &HStack_a8;
        if (pHStack_b8 != pHVar12) {
          auStack_e0._24_8_ = (_Base_ptr)0x1070ac;
          operator_delete(pHStack_b8);
          pHVar12 = extraout_RAX_00;
        }
        return (char *)pHVar12;
      }
      pHVar12 = *(HtmlparserCppTest **)&(pHVar10->contextMap)._M_t._M_impl;
      auStack_e0._24_8_ = (_Base_ptr)0x107095;
      pHVar11 = pHStack_b8;
      iVar5 = bcmp(pHVar12,pHStack_b8,(size_t)phVar19);
      if (iVar5 == 0) goto LAB_00107099;
    }
    auStack_e0._24_8_ = (_Base_ptr)0x1070b9;
    ValidateValue();
  }
  auStack_e0._24_8_ = ValidateAttributeType;
  ValidateValue();
  auStack_e0._24_8_ = this_00;
  auStack_e0._16_8_ = pHVar10;
  pHVar12 = (HtmlparserCppTest *)(pHVar12->parser_).parser_;
  iVar5 = ctemplate_htmlparser::htmlparser_attr_type((htmlparser_ctx_s *)pHVar12);
  puVar20 = kAttributeTypeMap;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kAttributeTypeMap,iVar5);
  if (*(long *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
    ValidateAttributeType();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_f0;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar6,&aStack_f1);
    sVar2 = *(size_t *)&(pHVar11->contextMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    puVar20 = (undefined1 *)pHVar6;
    if (sVar2 == sStack_e8) {
      uVar17 = (undefined7)((ulong)pHVar11 >> 8);
      if (sVar2 == 0) {
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar17,1);
      }
      else {
        puVar20 = (undefined1 *)pHStack_f0;
        iVar5 = bcmp(*(void **)&(pHVar11->contextMap)._M_t._M_impl,pHStack_f0,sVar2);
        pHVar11 = (HtmlparserCppTest *)CONCAT71(uVar17,iVar5 == 0);
      }
    }
    else {
      pHVar11 = (HtmlparserCppTest *)0x0;
    }
    pHVar6 = (HtmlparserCppTest *)auStack_e0;
    if (pHStack_f0 != pHVar6) {
      operator_delete(pHStack_f0);
      pHVar6 = extraout_RAX_01;
    }
    pHVar12 = pHStack_f0;
    if ((char)pHVar11 != '\0') {
      return (char *)pHVar6;
    }
  }
  ValidateAttributeType();
  uStack_118 = 0x10715c;
  pHStack_108 = pHVar11;
  bVar4 = StringToBool((string *)puVar20);
  uVar18 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
  phVar22 = (pHVar12->parser_).parser_;
  uStack_118 = 0x107167;
  uVar13 = ctemplate_htmlparser::htmlparser_is_attr_quoted(phVar22);
  bVar4 = (int)uVar13 != 0;
  if (SUB81(uVar18,0) == bVar4) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar4);
  }
  uStack_118 = 0x10717d;
  ValidateAttributeQuoted();
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x10718c;
  pHStack_120 = pHVar12;
  uStack_118 = uVar18;
  bVar4 = StringToBool((string *)puVar20);
  phVar19 = (htmlparser_ctx *)(CONCAT71(extraout_var_00,bVar4) & 0xffffffff);
  p_Var23 = *(_Base_ptr *)(phVar22 + 0x30);
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x107197;
  uVar13 = ctemplate_htmlparser::htmlparser_in_js((htmlparser_ctx_s *)p_Var23);
  bVar4 = (int)uVar13 != 0;
  if (SUB81(phVar19,0) == bVar4) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar4);
  }
  HStack_160.parser_.parser_ = (htmlparser_ctx *)0x1071ad;
  ValidateInJavascript();
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071bc;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)phVar22;
  HStack_160.parser_.parser_ = phVar19;
  bVar4 = StringToBool((string *)puVar20);
  p_Var24 = p_Var23[1]._M_left;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071c7;
  uVar13 = ctemplate_htmlparser::htmlparser_is_js_quoted((htmlparser_ctx_s *)p_Var24);
  bVar25 = (int)uVar13 != 0;
  if (bVar4 == bVar25) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x1071dd;
  ValidateJavascriptQuoted();
  pHVar12 = (HtmlparserCppTest *)p_Var24[1]._M_left;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var23;
  HStack_160.contextMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)this_00;
  iVar5 = ctemplate_htmlparser::htmlparser_js_state((htmlparser_ctx_s *)pHVar12);
  puVar21 = kJavascriptStateMap;
  pHVar6 = (HtmlparserCppTest *)IdToName(pHVar12,(IdNameMap *)kJavascriptStateMap,iVar5);
  if (*(long *)&(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    ValidateJavascriptState();
  }
  else {
    this_00 = (HtmlparserCppTest *)&pHStack_170;
    std::__cxx11::string::string((string *)this_00,(char *)pHVar6,&aStack_171);
    sVar2 = *(size_t *)
             &(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl.super__Rb_tree_header.
              _M_header;
    puVar21 = (undefined1 *)pHVar6;
    if (sVar2 == sStack_168) {
      if (sVar2 == 0) {
        bVar4 = true;
      }
      else {
        puVar21 = (undefined1 *)pHStack_170;
        iVar5 = bcmp(*(pointer *)&(((HtmlparserCppTest *)puVar20)->contextMap)._M_t._M_impl,
                     pHStack_170,sVar2);
        bVar4 = iVar5 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    pHVar6 = &HStack_160;
    if (pHStack_170 != pHVar6) {
      operator_delete(pHStack_170);
      pHVar6 = extraout_RAX_02;
    }
    pHVar12 = pHStack_170;
    if (bVar4) {
      return (char *)pHVar6;
    }
  }
  ValidateJavascriptState();
  bVar4 = StringToBool((string *)puVar21);
  p_Var23 = (_Base_ptr)(pHVar12->parser_).parser_;
  uVar13 = ctemplate_htmlparser::htmlparser_in_css((htmlparser_ctx_s *)p_Var23);
  bVar25 = (int)uVar13 != 0;
  if (bVar4 == bVar25) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  ValidateInCss();
  pHVar6 = (HtmlparserCppTest *)&pcStack_1b8;
  HStack_1b0.parser_ = (htmlparser_ctx *)pHVar12;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar4 = false;
    p_Var24 = p_Var23;
  }
  else {
    p_Stack_1c0 = (_Base_ptr)0x1072b8;
    pcStack_1b8 = extraout_RAX_03;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var24 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    p_Stack_1c0 = (_Base_ptr)0x1072d4;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var24,&pcStack_1b8,10);
    puVar21 = (undefined1 *)pHVar6;
    if (*pcStack_1b8 == '\0') {
      bVar4 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)&pcStack_1b8;
    }
    else {
      bVar4 = false;
      unaff_R12 = (_Base_ptr)&pcStack_1b8;
    }
  }
  if (bVar4) {
    p_Var24 = p_Var23[1]._M_left;
    p_Stack_1c0 = (_Base_ptr)0x1072fc;
    pcVar9 = (char *)ctemplate_htmlparser::htmlparser_get_line_number((htmlparser_ctx_s *)p_Var24);
    if ((int)this_00 == (int)pcVar9) {
      return pcVar9;
    }
  }
  else {
    p_Stack_1c0 = (_Base_ptr)0x107312;
    ValidateLine();
  }
  p_Stack_1c0 = (_Base_ptr)0x107317;
  ValidateLine();
  pHVar12 = (HtmlparserCppTest *)auStack_1e0;
  auStack_1e0._8_8_ = p_Var23;
  p_Stack_1d0 = unaff_R12;
  pHStack_1c8 = this_00;
  p_Stack_1c0 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar4 = false;
    p_Var23 = p_Var24;
  }
  else {
    p_Stack_1e8 = (_Base_ptr)0x107332;
    auStack_1e0._0_8_ = extraout_RAX_04;
    unaff_R15 = (_Base_ptr)__errno_location();
    unaff_R15->_M_color = _S_red;
    p_Var23 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    p_Stack_1e8 = (_Base_ptr)0x10734e;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var23,(char **)auStack_1e0,10);
    puVar21 = (undefined1 *)pHVar12;
    if (*(char *)auStack_1e0._0_8_ == '\0') {
      bVar4 = unaff_R15->_M_color == _S_red;
      unaff_R12 = (_Base_ptr)auStack_1e0;
    }
    else {
      bVar4 = false;
      unaff_R12 = (_Base_ptr)auStack_1e0;
    }
  }
  if (bVar4) {
    p_Var23 = p_Var24[1]._M_left;
    p_Stack_1e8 = (_Base_ptr)0x107376;
    pcVar9 = (char *)ctemplate_htmlparser::htmlparser_get_column_number((htmlparser_ctx_s *)p_Var23)
    ;
    if ((int)this_00 == (int)pcVar9) {
      return pcVar9;
    }
  }
  else {
    p_Stack_1e8 = (_Base_ptr)0x10738c;
    ValidateColumn();
  }
  p_Stack_1e8 = (_Base_ptr)0x107391;
  ValidateColumn();
  pHVar12 = (HtmlparserCppTest *)auStack_208;
  auStack_208._8_8_ = p_Var24;
  p_Stack_1f8 = unaff_R12;
  pHStack_1f0 = this_00;
  p_Stack_1e8 = unaff_R15;
  if (*(long *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl.super__Rb_tree_header.
                _M_header == 0) {
    bVar4 = false;
    p_Var24 = p_Var23;
  }
  else {
    auStack_208._0_8_ = extraout_RAX_05;
    piVar14 = __errno_location();
    *piVar14 = 0;
    p_Var24 = *(_Base_ptr *)&(((HtmlparserCppTest *)puVar21)->contextMap)._M_t._M_impl;
    this_00 = (HtmlparserCppTest *)strtol((char *)p_Var24,(char **)auStack_208,10);
    puVar21 = (undefined1 *)pHVar12;
    if (*(char *)auStack_208._0_8_ == '\0') {
      bVar4 = *piVar14 == 0;
      unaff_R12 = (_Base_ptr)auStack_208;
    }
    else {
      bVar4 = false;
      unaff_R12 = (_Base_ptr)auStack_208;
    }
  }
  if (bVar4) {
    p_Var24 = p_Var23[1]._M_left;
    pcVar9 = (char *)ctemplate_htmlparser::htmlparser_value_index((htmlparser_ctx_s *)p_Var24);
    if ((int)this_00 == (int)pcVar9) {
      return pcVar9;
    }
  }
  else {
    ValidateValueIndex();
  }
  ValidateValueIndex();
  bVar4 = StringToBool((string *)puVar21);
  pHVar12 = (HtmlparserCppTest *)p_Var24[1]._M_left;
  uVar13 = ctemplate_htmlparser::htmlparser_is_url_start((htmlparser_ctx_s *)pHVar12);
  bVar25 = (int)uVar13 != 0;
  if (bVar4 == bVar25) {
    return (char *)CONCAT71((int7)((ulong)uVar13 >> 8),bVar25);
  }
  ValidateIsUrlStart();
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_268.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Stack_250 = p_Var24;
  p_Stack_248 = unaff_R12;
  SplitStringIntoKeyValuePairs((string *)puVar21,"=",",",&vStack_268);
  if (vStack_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_268.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(pHVar12->contextMap)._M_t._M_impl.super__Rb_tree_header;
    str_00 = vStack_268.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      StripWhiteSpace(&str_00->first);
      str = &str_00->second;
      StripWhiteSpace(str);
      iVar5 = std::__cxx11::string::compare((char *)str_00);
      if (iVar5 == 0) {
        ValidateState(pHVar12,str);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)str_00);
        if (iVar5 == 0) {
          ValidateTag(pHVar12,str);
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)str_00);
          if (iVar5 == 0) {
            ValidateAttribute(pHVar12,str);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)str_00);
            if (iVar5 == 0) {
              ValidateValue(pHVar12,str);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)str_00);
              if (iVar5 == 0) {
                ValidateAttributeType(pHVar12,str);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)str_00);
                if (iVar5 == 0) {
                  ValidateAttributeQuoted(pHVar12,str);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)str_00);
                  if (iVar5 == 0) {
                    ValidateInJavascript(pHVar12,str);
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)str_00);
                    if (iVar5 == 0) {
                      ValidateJavascriptQuoted(pHVar12,str);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)str_00);
                      if (iVar5 == 0) {
                        ValidateJavascriptState(pHVar12,str);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)str_00);
                        if (iVar5 == 0) {
                          ValidateInCss(pHVar12,str);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)str_00);
                          if (iVar5 == 0) {
                            ValidateLine(pHVar12,str);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)str_00);
                            if (iVar5 == 0) {
                              ValidateColumn(pHVar12,str);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)str_00);
                              if (iVar5 == 0) {
                                ValidateValueIndex(pHVar12,str);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)str_00);
                                if (iVar5 == 0) {
                                  ValidateIsUrlStart(pHVar12,str);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)str_00);
                                  if (iVar5 == 0) {
                                    cVar15 = std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                    if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
                                      this_01 = (HtmlParser *)operator_new(8);
                                      HtmlParser::HtmlParser(this_01);
                                      ppHVar16 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      *ppHVar16 = this_01;
                                    }
                                    ppHVar16 = std::
                                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::operator[](&pHVar12->contextMap,str);
                                    HtmlParser::CopyFrom(*ppHVar16,&pHVar12->parser_);
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)str_00);
                                    if (iVar5 == 0) {
                                      cVar15 = std::
                                               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                               ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                  *)pHVar12,str);
                                      if ((_Rb_tree_header *)cVar15._M_node == p_Var1) {
                                        ProcessAnnotation();
LAB_0010784b:
                                        ProcessAnnotation();
                                        std::
                                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::~vector(&vStack_268);
                                        _Unwind_Resume(extraout_RAX_07);
                                      }
                                      ppHVar16 = std::
                                                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ctemplate_htmlparser::HtmlParser_*>_>_>
                                                 ::operator[](&pHVar12->contextMap,str);
                                      HtmlParser::CopyFrom(&pHVar12->parser_,*ppHVar16);
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)str_00);
                                      if (iVar5 == 0) {
                                        bVar4 = StringToBool(str);
                                        if (bVar4) {
                                          ctemplate_htmlparser::htmlparser_reset
                                                    ((pHVar12->parser_).parser_);
                                        }
                                      }
                                      else {
                                        this_02 = str_00;
                                        iVar5 = std::__cxx11::string::compare((char *)str_00);
                                        if (iVar5 == 0) {
                                          iVar5 = NameToId((HtmlparserCppTest *)this_02,
                                                           (IdNameMap *)kResetModeMap,str);
                                          ctemplate_htmlparser::htmlparser_reset_mode
                                                    ((pHVar12->parser_).parser_,iVar5);
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)str_00);
                                          if (iVar5 != 0) goto LAB_0010784b;
                                          bVar4 = StringToBool(str);
                                          if (bVar4) {
                                            ctemplate_htmlparser::htmlparser_insert_text
                                                      ((pHVar12->parser_).parser_);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      str_00 = str_00 + 1;
    } while (str_00 != vStack_268.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_268);
  return extraout_RAX_06;
}

Assistant:

const char *HtmlparserCppTest::IdToName(const struct IdNameMap *list,
                                        int enum_id) {
  CHECK(list != NULL);
  while (list->name) {
    if (enum_id == list->id) {
      return list->name;
    }
    list++;
  }
  LOG(FATAL) << "Unknown id";
}